

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O0

bool __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::remove_least_element_in_tree
          (binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,node *t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r)

{
  binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  node *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte bVar1;
  bool rvalue;
  node *child;
  node *next;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  node *this_00;
  node *t_00;
  node *local_10;
  
  t_00 = in_RSI->left;
  if (t_00 == *(node **)(in_RDI + 0x30)) {
    if (in_RSI->parent->left == in_RSI) {
      this_00 = in_RSI->right;
      in_RSI->parent->left = this_00;
    }
    else {
      this_00 = in_RSI->right;
      in_RSI->parent->right = this_00;
    }
    local_10 = in_RSI;
    if (in_RSI == *(node **)(in_RDI + 0x40)) {
      *(node **)(in_RDI + 0x40) = this_00;
    }
  }
  else {
    do {
      local_10 = t_00;
      t_00 = local_10->left;
    } while (t_00 != *(node **)(in_RDI + 0x30));
    this_00 = local_10->right;
    local_10->parent->left = this_00;
  }
  exchange<std::__cxx11::string>(in_RDI,in_stack_ffffffffffffffb8);
  exchange<std::__cxx11::string>(in_RDI,in_stack_ffffffffffffffb8);
  this_00->parent = (node *)local_10->parent;
  if (local_10->color == '\x01') {
    fix_after_remove(in_RCX,t_00);
  }
  bVar1 = local_10 == *(node **)(in_RDI + 0x48);
  memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
  ::deallocate((memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
                *)this_00,(node *)CONCAT17(bVar1,in_stack_ffffffffffffffc8));
  return (bool)(bVar1 & 1);
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    remove_least_element_in_tree (
        node* t,
        domain& d,
        range& r
    ) 
    {

        node* next = t->left;
        node* child;  // the child node of the one we will slice out

        if (next == NIL)
        {
            // need to determine if t is a left or right child
            if (t->parent->left == t)
                child = t->parent->left = t->right;
            else
                child = t->parent->right = t->right;

            // update tree_root if necessary
            if (t == tree_root)
                tree_root = child;
        }
        else
        {
            // find the least node
            do 
            {
                t = next;
                next = next->left;
            } while (next != NIL);
            // t is a left child
            child = t->parent->left = t->right;

        }
        
        // swap the item from this node into d and r
        exchange(d,t->d);
        exchange(r,t->r);

        // plug hole left by removing this node
        child->parent = t->parent;

        // keep the red-black properties true
        if (t->color == black)
            fix_after_remove(child);

        bool rvalue = (t == current_element);
        // free the memory for this removed node
        pool.deallocate(t);        
        return rvalue;
    }